

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XarHelpers.cpp
# Opt level: O1

optional<unsigned_long> tools::xar::read_sysfs_cgroup_inode(char *filename)

{
  int iVar1;
  ulong uVar2;
  long *plVar3;
  undefined8 uVar4;
  size_t in_RCX;
  __nlink_t *p_Var5;
  long *plVar6;
  char *in_RDX;
  _Storage<unsigned_long,_true> __return_storage_ptr__;
  ssize_t in_R9;
  long lVar7;
  optional<unsigned_long> oVar8;
  string_view s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> contents;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> path;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  components;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  maybe_contents;
  stat st;
  allocator<char> local_171;
  long *local_170;
  char *local_168;
  long local_160 [2];
  long *local_150;
  long local_148;
  long local_140;
  long lStack_138;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_130;
  long *local_118;
  long local_110;
  long local_108 [2];
  char local_f8;
  long *local_f0 [2];
  long local_e0 [2];
  char *local_d0 [2];
  stat local_c0;
  
  __return_storage_ptr__._M_value = (unsigned_long)&local_118;
  (anonymous_namespace)::read_file_prefix_abi_cxx11_
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)__return_storage_ptr__,(_anonymous_namespace_ *)filename,in_RDX,in_RCX);
  if (local_f8 == '\x01') {
    local_170 = local_160;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_170,local_118,local_110 + (long)local_118);
    if (local_168 == (char *)0x1000) {
      uVar2 = 0;
    }
    else {
      local_c0.st_dev = CONCAT71(local_c0.st_dev._1_7_,0x3a);
      s._M_str = (char *)0xffffffffffffffff;
      s._M_len = (size_t)local_170;
      split<char>(&local_130,(xar *)&local_c0,local_168,s,in_R9);
      if ((ulong)((long)local_130.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_130.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) < 0x41) {
        uVar2 = 0;
      }
      else {
        uVar2 = std::__cxx11::string::find
                          ((char)local_130.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + '@',10);
        if (uVar2 != 0xffffffffffffffff) {
          if (local_130.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[2]._M_string_length < uVar2) {
            uVar4 = std::__throw_out_of_range_fmt
                              ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                               "basic_string::erase",uVar2);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_130);
            if (local_170 != local_160) {
              operator_delete(local_170,local_160[0] + 1);
            }
            if ((local_f8 == '\x01') && (local_f8 = '\0', local_118 != local_108)) {
              operator_delete(local_118,local_108[0] + 1);
            }
            _Unwind_Resume(uVar4);
          }
          local_130.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[2]._M_string_length = uVar2;
          local_130.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p[uVar2] = '\0';
        }
        local_d0[0] = "/sys/fs/cgroup";
        local_d0[1] = "/cgroup2";
        lVar7 = 0;
        do {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_f0,*(char **)((long)local_d0 + lVar7),&local_171);
          plVar3 = (long *)std::__cxx11::string::append((char *)local_f0);
          p_Var5 = (__nlink_t *)(plVar3 + 2);
          if ((__nlink_t *)*plVar3 == p_Var5) {
            local_c0.st_nlink = *p_Var5;
            local_c0._24_8_ = plVar3[3];
            local_c0.st_dev = (__dev_t)&local_c0.st_nlink;
          }
          else {
            local_c0.st_nlink = *p_Var5;
            local_c0.st_dev = (__dev_t)*plVar3;
          }
          local_c0.st_ino = *(__ino_t *)(plVar3 + 1);
          *plVar3 = (long)p_Var5;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          plVar3 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_c0,
                                      (ulong)local_130.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start[2].
                                             _M_dataplus._M_p);
          plVar6 = plVar3 + 2;
          if ((long *)*plVar3 == plVar6) {
            local_140 = *plVar6;
            lStack_138 = plVar3[3];
            local_150 = &local_140;
          }
          else {
            local_140 = *plVar6;
            local_150 = (long *)*plVar3;
          }
          local_148 = plVar3[1];
          *plVar3 = (long)plVar6;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          if ((__nlink_t *)local_c0.st_dev != &local_c0.st_nlink) {
            operator_delete((void *)local_c0.st_dev,local_c0.st_nlink + 1);
          }
          if (local_f0[0] != local_e0) {
            operator_delete(local_f0[0],local_e0[0] + 1);
          }
          iVar1 = stat((char *)local_150,&local_c0);
          __return_storage_ptr__ = (_Storage<unsigned_long,_true>)local_c0.st_ino;
          if (iVar1 == 0) {
            if (local_150 != &local_140) {
              operator_delete(local_150,local_140 + 1);
            }
            uVar2 = CONCAT71((int7)((ulong)&local_140 >> 8),1);
            goto LAB_001086b8;
          }
          if (local_150 != &local_140) {
            operator_delete(local_150,local_140 + 1);
          }
          lVar7 = lVar7 + 8;
        } while (lVar7 != 0x10);
        uVar2 = 0;
        __return_storage_ptr__._M_value = (unsigned_long)local_f0;
      }
LAB_001086b8:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_130);
    }
    if (local_170 != local_160) {
      operator_delete(local_170,local_160[0] + 1);
    }
  }
  else {
    uVar2 = 0;
  }
  if ((local_f8 == '\x01') && (local_f8 = 0, local_118 != local_108)) {
    operator_delete(local_118,local_108[0] + 1);
  }
  oVar8.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = uVar2 & 0xffffffff;
  oVar8.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = __return_storage_ptr__._M_value;
  return (optional<unsigned_long>)
         oVar8.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

std::optional<ino_t> read_sysfs_cgroup_inode(const char* filename) {
  const auto maybe_contents = read_file_prefix(filename, 4096);
  if (!maybe_contents) {
    return std::nullopt;
  }
  const auto contents = *maybe_contents;
  if (contents.size() == 4096) {
    return std::nullopt;
  }

  // File contents are a colon-separated triplet.  We want the last
  // field, and to toss out the trailing newline.
  auto components = tools::xar::split(':', contents);
  if (components.size() < 3) {
    return std::nullopt;
  }
  auto newline_pos = components[2].find('\n');
  if (newline_pos != std::string::npos) {
    components[2].erase(newline_pos);
  }

  // /sys/fs/cgroup is the typical mount point for the cgroup2
  // filesystem, but it is not guaranteed.  In some FB environments
  // we've historically used /cgroup2 instead.
  for (auto& candidate : {"/sys/fs/cgroup", "/cgroup2"}) {
    auto path = std::string(candidate) + "/" + components[2];
    struct stat st;
    if (stat(path.c_str(), &st) == 0) {
      return st.st_ino;
    }
  }

  return std::nullopt;
}